

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O3

int run_test_spawn_stdin(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *puVar2;
  uv_loop_t *puVar3;
  uv_process_options_t *puVar4;
  int extraout_EDX;
  undefined1 *puVar5;
  uv__queue **ppuVar6;
  uv_handle_t *puVar7;
  int64_t eval_b_1;
  int64_t eval_a_1;
  uv_buf_t buf;
  char buffer [23];
  uv_stdio_container_t stdio [2];
  uv_write_t write_req;
  uv_pipe_t in;
  uv_pipe_t out;
  undefined1 auStack_648 [48];
  uv_loop_t *puStack_618;
  long lStack_608;
  long lStack_600;
  uv_loop_t *puStack_5f8;
  uv_process_options_t *puStack_5f0;
  long lStack_5e0;
  long lStack_5d8;
  uv_os_fd_t uStack_5cc;
  uv_stdio_container_t uStack_5c8;
  undefined4 uStack_5b8;
  undefined4 uStack_5b0;
  undefined4 uStack_5a8;
  undefined4 uStack_5a0;
  undefined4 uStack_598;
  uv_os_fd_t uStack_590;
  sockaddr_in sStack_588;
  uv_loop_t *puStack_578;
  undefined8 uStack_570;
  long lStack_568;
  uv_tcp_t uStack_560;
  long lStack_488;
  long lStack_480;
  uv_stdio_container_t uStack_478;
  undefined4 uStack_468;
  undefined4 uStack_458;
  undefined4 uStack_448;
  uv_loop_t *puStack_440;
  uv_stream_t uStack_430;
  uv_loop_t *puStack_348;
  anon_union_8_2_13e1ed65_for_data aStack_340;
  uv__queue *local_318;
  uv__queue *local_310;
  undefined1 local_308 [16];
  char local_2f8 [32];
  uv_stdio_container_t local_2d8;
  undefined4 local_2c8;
  uv_loop_t *local_2c0;
  uv_write_t local_2b0;
  uv_stream_t local_1e8;
  
  builtin_strncpy(local_2f8,"hello-from-spawn_stdin",0x17);
  init_process_options("spawn_helper3",exit_cb);
  puVar2 = uv_default_loop();
  puVar3 = (uv_loop_t *)&stack0xffffffffffffff00;
  uv_pipe_init(puVar2,(uv_pipe_t *)puVar3,0);
  puVar2 = uv_default_loop();
  uv_pipe_init(puVar2,(uv_pipe_t *)&local_1e8,0);
  options.stdio = &local_2d8;
  local_2d8.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
  local_2c8 = 0x21;
  options.stdio_count = 2;
  local_2d8.data.stream = &local_1e8;
  local_2c0 = puVar3;
  puVar2 = uv_default_loop();
  iVar1 = uv_spawn(puVar2,&process,&options);
  local_2b0.data = (void *)(long)iVar1;
  local_308._0_8_ = (char *)0x0;
  if ((uv__queue *)local_2b0.data == (uv__queue *)0x0) {
    local_308._0_8_ = local_2f8;
    local_308._8_8_ = 0x17;
    iVar1 = uv_write(&local_2b0,&local_1e8,(uv_buf_t *)local_308,1,write_cb);
    local_310 = (uv__queue *)(long)iVar1;
    local_318 = (uv__queue *)0x0;
    if (local_310 != (uv__queue *)0x0) goto LAB_001bc9b1;
    iVar1 = uv_read_start((uv_stream_t *)&stack0xffffffffffffff00,on_alloc,on_read);
    local_310 = (uv__queue *)(long)iVar1;
    local_318 = (uv__queue *)0x0;
    if (local_310 != (uv__queue *)0x0) goto LAB_001bc9be;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    local_310 = (uv__queue *)(long)iVar1;
    local_318 = (uv__queue *)0x0;
    if (local_310 != (uv__queue *)0x0) goto LAB_001bc9cb;
    local_310 = (uv__queue *)0x1;
    local_318 = (uv__queue *)(long)exit_cb_called;
    if (local_318 != (uv__queue *)0x1) goto LAB_001bc9d8;
    local_310 = (uv__queue *)0x3;
    local_318 = (uv__queue *)(long)close_cb_called;
    if (local_318 != (uv__queue *)0x3) goto LAB_001bc9e5;
    iVar1 = strcmp(local_2f8,output);
    local_310 = (uv__queue *)(long)iVar1;
    local_318 = (uv__queue *)0x0;
    if (local_310 != (uv__queue *)0x0) goto LAB_001bc9f2;
    puVar3 = uv_default_loop();
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    uv_run(puVar3,UV_RUN_DEFAULT);
    local_310 = (uv__queue *)0x0;
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    local_318 = (uv__queue *)(long)iVar1;
    if (local_310 == local_318) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_stdin_cold_1();
LAB_001bc9b1:
    run_test_spawn_stdin_cold_2();
LAB_001bc9be:
    run_test_spawn_stdin_cold_3();
LAB_001bc9cb:
    run_test_spawn_stdin_cold_4();
LAB_001bc9d8:
    run_test_spawn_stdin_cold_5();
LAB_001bc9e5:
    run_test_spawn_stdin_cold_6();
LAB_001bc9f2:
    run_test_spawn_stdin_cold_7();
  }
  iVar1 = (int)&local_318;
  ppuVar6 = &local_310;
  run_test_spawn_stdin_cold_8();
  if (iVar1 == 0) {
    uv_close((uv_handle_t *)ppuVar6[0xb],close_cb);
    return extraout_EAX;
  }
  write_cb_cold_1();
  uStack_560.queued_fds = (void *)0x1bca6e;
  puStack_348 = puVar3;
  aStack_340.stream = &local_1e8;
  init_process_options("spawn_helper5",exit_cb);
  uStack_560.queued_fds = (void *)0x1bca73;
  puVar3 = uv_default_loop();
  puVar4 = (uv_process_options_t *)&uStack_430;
  uStack_560.queued_fds = (void *)0x1bca87;
  uv_pipe_init(puVar3,(uv_pipe_t *)puVar4,0);
  options.stdio = &uStack_478;
  uStack_478.flags = UV_IGNORE;
  uStack_468 = 0;
  uStack_458 = 0;
  uStack_448 = 0x21;
  options.stdio_count = 4;
  uStack_560.queued_fds = (void *)0x1bcabc;
  puStack_440 = (uv_loop_t *)puVar4;
  puVar3 = uv_default_loop();
  uStack_560.queued_fds = (void *)0x1bcace;
  iVar1 = uv_spawn(puVar3,&process,&options);
  lStack_480 = (long)iVar1;
  lStack_488 = 0;
  if (lStack_480 == 0) {
    uStack_560.queued_fds = (void *)0x1bcb04;
    iVar1 = uv_read_start(&uStack_430,on_alloc,on_read);
    lStack_480 = (long)iVar1;
    lStack_488 = 0;
    if (lStack_480 != 0) goto LAB_001bcc44;
    uStack_560.queued_fds = (void *)0x1bcb27;
    puVar3 = uv_default_loop();
    uStack_560.queued_fds = (void *)0x1bcb31;
    iVar1 = uv_run(puVar3,UV_RUN_DEFAULT);
    lStack_480 = (long)iVar1;
    lStack_488 = 0;
    if (lStack_480 != 0) goto LAB_001bcc51;
    lStack_480 = 1;
    lStack_488 = (long)exit_cb_called;
    if (lStack_488 != 1) goto LAB_001bcc5e;
    lStack_480 = 2;
    lStack_488 = (long)close_cb_called;
    if (lStack_488 != 2) goto LAB_001bcc6b;
    uStack_560.queued_fds = (void *)0x1bcbad;
    printf("output from stdio[3] is: %s",output);
    uStack_560.queued_fds = (void *)0x1bcbbc;
    iVar1 = strcmp("fourth stdio!\n",output);
    lStack_480 = (long)iVar1;
    lStack_488 = 0;
    puVar4 = (uv_process_options_t *)output;
    if (lStack_480 != 0) goto LAB_001bcc78;
    uStack_560.queued_fds = (void *)0x1bcbdf;
    puVar4 = (uv_process_options_t *)uv_default_loop();
    uStack_560.queued_fds = (void *)0x1bcbf3;
    uv_walk((uv_loop_t *)puVar4,close_walk_cb,(void *)0x0);
    uStack_560.queued_fds = (void *)0x1bcbfd;
    uv_run((uv_loop_t *)puVar4,UV_RUN_DEFAULT);
    lStack_480 = 0;
    uStack_560.queued_fds = (void *)0x1bcc0b;
    puVar3 = uv_default_loop();
    uStack_560.queued_fds = (void *)0x1bcc13;
    iVar1 = uv_loop_close(puVar3);
    lStack_488 = (long)iVar1;
    if (lStack_480 == lStack_488) {
      uStack_560.queued_fds = (void *)0x1bcc29;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    uStack_560.queued_fds = (void *)0x1bcc44;
    run_test_spawn_stdio_greater_than_3_cold_1();
LAB_001bcc44:
    uStack_560.queued_fds = (void *)0x1bcc51;
    run_test_spawn_stdio_greater_than_3_cold_2();
LAB_001bcc51:
    uStack_560.queued_fds = (void *)0x1bcc5e;
    run_test_spawn_stdio_greater_than_3_cold_3();
LAB_001bcc5e:
    uStack_560.queued_fds = (void *)0x1bcc6b;
    run_test_spawn_stdio_greater_than_3_cold_4();
LAB_001bcc6b:
    uStack_560.queued_fds = (void *)0x1bcc78;
    run_test_spawn_stdio_greater_than_3_cold_5();
LAB_001bcc78:
    uStack_560.queued_fds = (void *)0x1bcc85;
    run_test_spawn_stdio_greater_than_3_cold_6();
  }
  uStack_560.queued_fds = spawn_tcp_server_helper;
  run_test_spawn_stdio_greater_than_3_cold_7();
  puStack_578 = (uv_loop_t *)0x1bcc9e;
  puVar3 = uv_default_loop();
  puStack_578 = (uv_loop_t *)0x1bccab;
  iVar1 = uv_tcp_init(puVar3,&uStack_560);
  lStack_568 = (long)iVar1;
  uStack_570 = 0;
  if (lStack_568 == 0) {
    puStack_578 = (uv_loop_t *)0x1bccd4;
    iVar1 = uv_tcp_open(&uStack_560,3);
    lStack_568 = (long)iVar1;
    uStack_570 = 0;
    if (lStack_568 != 0) goto LAB_001bcd33;
    puStack_578 = (uv_loop_t *)0x1bccff;
    iVar1 = uv_listen((uv_stream_t *)&uStack_560,0x1000,(uv_connection_cb)0x0);
    lStack_568 = (long)iVar1;
    uStack_570 = 0;
    if (lStack_568 == 0) {
      return 1;
    }
  }
  else {
    puStack_578 = (uv_loop_t *)0x1bcd33;
    spawn_tcp_server_helper_cold_1();
LAB_001bcd33:
    puStack_578 = (uv_loop_t *)0x1bcd40;
    spawn_tcp_server_helper_cold_2();
  }
  puStack_578 = (uv_loop_t *)run_test_spawn_tcp_server;
  spawn_tcp_server_helper_cold_3();
  puStack_5f0 = (uv_process_options_t *)0x1bcd65;
  puStack_578 = (uv_loop_t *)puVar4;
  init_process_options("spawn_tcp_server_helper",exit_cb);
  puStack_5f0 = (uv_process_options_t *)0x1bcd7b;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_588);
  uStack_5c8._0_8_ = SEXT48(iVar1);
  lStack_5e0 = 0;
  if (uStack_5c8._0_8_ == 0) {
    puStack_5f0 = (uv_process_options_t *)0x1bcda0;
    puVar3 = uv_default_loop();
    puStack_5f0 = (uv_process_options_t *)0x1bcdb4;
    iVar1 = uv_tcp_init_ex(puVar3,&tcp_server,2);
    uStack_5c8._0_8_ = SEXT48(iVar1);
    lStack_5e0 = 0;
    if (uStack_5c8._0_8_ != 0) goto LAB_001bcf99;
    puStack_5f0 = (uv_process_options_t *)0x1bcde7;
    iVar1 = uv_tcp_bind(&tcp_server,(sockaddr *)&sStack_588,0);
    uStack_5c8._0_8_ = SEXT48(iVar1);
    lStack_5e0 = 0;
    if (uStack_5c8._0_8_ != 0) goto LAB_001bcfa8;
    puStack_5f0 = (uv_process_options_t *)0x1bce18;
    iVar1 = uv_fileno((uv_handle_t *)&tcp_server,&uStack_5cc);
    uStack_5c8._0_8_ = SEXT48(iVar1);
    lStack_5e0 = 0;
    if (uStack_5c8._0_8_ != 0) goto LAB_001bcfb7;
    options.stdio = &uStack_5c8;
    puVar4 = &options;
    uStack_5c8._4_4_ = iVar1 >> 0x1f;
    uStack_5c8.flags = 2;
    uStack_5c8.data.file = 0;
    uStack_5b8 = 2;
    uStack_5b0 = 1;
    uStack_5a8 = 2;
    uStack_5a0 = 2;
    uStack_598 = 2;
    uStack_590 = uStack_5cc;
    options.stdio_count = 4;
    puStack_5f0 = (uv_process_options_t *)0x1bce82;
    puVar3 = uv_default_loop();
    puStack_5f0 = (uv_process_options_t *)0x1bce94;
    iVar1 = uv_spawn(puVar3,&process,&options);
    lStack_5e0 = (long)iVar1;
    lStack_5d8 = 0;
    if (lStack_5e0 != 0) goto LAB_001bcfc6;
    puStack_5f0 = (uv_process_options_t *)0x1bceb9;
    puVar3 = uv_default_loop();
    puStack_5f0 = (uv_process_options_t *)0x1bcec3;
    iVar1 = uv_run(puVar3,UV_RUN_DEFAULT);
    lStack_5e0 = (long)iVar1;
    lStack_5d8 = 0;
    if (lStack_5e0 != 0) goto LAB_001bcfd5;
    lStack_5e0 = 1;
    lStack_5d8 = (long)exit_cb_called;
    if (lStack_5d8 != 1) goto LAB_001bcfe4;
    lStack_5e0 = 1;
    lStack_5d8 = (long)close_cb_called;
    if (lStack_5d8 != 1) goto LAB_001bcff3;
    puStack_5f0 = (uv_process_options_t *)0x1bcf32;
    puVar4 = (uv_process_options_t *)uv_default_loop();
    puStack_5f0 = (uv_process_options_t *)0x1bcf46;
    uv_walk((uv_loop_t *)puVar4,close_walk_cb,(void *)0x0);
    puStack_5f0 = (uv_process_options_t *)0x1bcf50;
    uv_run((uv_loop_t *)puVar4,UV_RUN_DEFAULT);
    lStack_5e0 = 0;
    puStack_5f0 = (uv_process_options_t *)0x1bcf5e;
    puVar3 = uv_default_loop();
    puStack_5f0 = (uv_process_options_t *)0x1bcf66;
    iVar1 = uv_loop_close(puVar3);
    lStack_5d8 = (long)iVar1;
    if (lStack_5e0 == lStack_5d8) {
      puStack_5f0 = (uv_process_options_t *)0x1bcf82;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_5f0 = (uv_process_options_t *)0x1bcf99;
    run_test_spawn_tcp_server_cold_1();
LAB_001bcf99:
    puStack_5f0 = (uv_process_options_t *)0x1bcfa8;
    run_test_spawn_tcp_server_cold_2();
LAB_001bcfa8:
    puStack_5f0 = (uv_process_options_t *)0x1bcfb7;
    run_test_spawn_tcp_server_cold_3();
LAB_001bcfb7:
    puStack_5f0 = (uv_process_options_t *)0x1bcfc6;
    run_test_spawn_tcp_server_cold_4();
LAB_001bcfc6:
    puStack_5f0 = (uv_process_options_t *)0x1bcfd5;
    run_test_spawn_tcp_server_cold_5();
LAB_001bcfd5:
    puStack_5f0 = (uv_process_options_t *)0x1bcfe4;
    run_test_spawn_tcp_server_cold_6();
LAB_001bcfe4:
    puStack_5f0 = (uv_process_options_t *)0x1bcff3;
    run_test_spawn_tcp_server_cold_7();
LAB_001bcff3:
    puStack_5f0 = (uv_process_options_t *)0x1bd002;
    run_test_spawn_tcp_server_cold_8();
  }
  puStack_5f0 = (uv_process_options_t *)run_test_spawn_ignored_stdio;
  run_test_spawn_tcp_server_cold_9();
  puStack_5f0 = &options;
  puStack_618 = (uv_loop_t *)0x1bd02b;
  puStack_5f8 = (uv_loop_t *)puVar4;
  init_process_options("spawn_helper6",exit_cb);
  options.stdio = (uv_stdio_container_t *)0x0;
  puVar4 = &options;
  options.stdio_count = 0;
  puStack_618 = (uv_loop_t *)0x1bd04b;
  puVar3 = uv_default_loop();
  puStack_618 = (uv_loop_t *)0x1bd05d;
  iVar1 = uv_spawn(puVar3,&process,&options);
  lStack_600 = (long)iVar1;
  lStack_608 = 0;
  if (lStack_600 == 0) {
    puStack_618 = (uv_loop_t *)0x1bd07e;
    puVar3 = uv_default_loop();
    puStack_618 = (uv_loop_t *)0x1bd088;
    iVar1 = uv_run(puVar3,UV_RUN_DEFAULT);
    lStack_600 = (long)iVar1;
    lStack_608 = 0;
    if (lStack_600 != 0) goto LAB_001bd15c;
    lStack_600 = 1;
    lStack_608 = (long)exit_cb_called;
    if (lStack_608 != 1) goto LAB_001bd16b;
    lStack_600 = 1;
    lStack_608 = (long)close_cb_called;
    if (lStack_608 != 1) goto LAB_001bd17a;
    puStack_618 = (uv_loop_t *)0x1bd0f7;
    puVar4 = (uv_process_options_t *)uv_default_loop();
    puStack_618 = (uv_loop_t *)0x1bd10b;
    uv_walk((uv_loop_t *)puVar4,close_walk_cb,(void *)0x0);
    puStack_618 = (uv_loop_t *)0x1bd115;
    uv_run((uv_loop_t *)puVar4,UV_RUN_DEFAULT);
    lStack_600 = 0;
    puStack_618 = (uv_loop_t *)0x1bd123;
    puVar3 = uv_default_loop();
    puStack_618 = (uv_loop_t *)0x1bd12b;
    iVar1 = uv_loop_close(puVar3);
    lStack_608 = (long)iVar1;
    if (lStack_600 == lStack_608) {
      puStack_618 = (uv_loop_t *)0x1bd143;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_618 = (uv_loop_t *)0x1bd15c;
    run_test_spawn_ignored_stdio_cold_1();
LAB_001bd15c:
    puStack_618 = (uv_loop_t *)0x1bd16b;
    run_test_spawn_ignored_stdio_cold_2();
LAB_001bd16b:
    puStack_618 = (uv_loop_t *)0x1bd17a;
    run_test_spawn_ignored_stdio_cold_3();
LAB_001bd17a:
    puStack_618 = (uv_loop_t *)0x1bd189;
    run_test_spawn_ignored_stdio_cold_4();
  }
  puStack_618 = (uv_loop_t *)run_test_spawn_and_kill;
  run_test_spawn_ignored_stdio_cold_5();
  puVar5 = auStack_648 + 0x20;
  auStack_648._24_8_ = (uv_close_cb)0x1bd1b0;
  puStack_618 = (uv_loop_t *)puVar4;
  init_process_options("spawn_helper4",kill_cb);
  auStack_648._24_8_ = (uv_close_cb)0x1bd1b5;
  puVar3 = uv_default_loop();
  auStack_648._24_8_ = (uv_close_cb)0x1bd1cb;
  iVar1 = uv_spawn(puVar3,&process,&options);
  auStack_648._40_8_ = SEXT48(iVar1);
  auStack_648._32_8_ = (uv__queue *)0x0;
  if ((uv__queue *)auStack_648._40_8_ == (uv__queue *)0x0) {
    auStack_648._24_8_ = (uv_close_cb)0x1bd1ee;
    puVar3 = uv_default_loop();
    auStack_648._24_8_ = (uv_close_cb)0x1bd1fd;
    iVar1 = uv_timer_init(puVar3,&timer);
    auStack_648._40_8_ = SEXT48(iVar1);
    auStack_648._32_8_ = (uv__queue *)0x0;
    if ((uv__queue *)auStack_648._40_8_ != (uv__queue *)0x0) goto LAB_001bd32a;
    auStack_648._24_8_ = (uv_close_cb)0x1bd235;
    iVar1 = uv_timer_start(&timer,timer_cb,500,0);
    auStack_648._40_8_ = SEXT48(iVar1);
    auStack_648._32_8_ = (uv__queue *)0x0;
    if ((uv__queue *)auStack_648._40_8_ != (uv__queue *)0x0) goto LAB_001bd337;
    auStack_648._24_8_ = (uv_close_cb)0x1bd258;
    puVar3 = uv_default_loop();
    auStack_648._24_8_ = (uv_close_cb)0x1bd262;
    iVar1 = uv_run(puVar3,UV_RUN_DEFAULT);
    auStack_648._40_8_ = SEXT48(iVar1);
    auStack_648._32_8_ = (uv__queue *)0x0;
    if ((uv__queue *)auStack_648._40_8_ != (uv__queue *)0x0) goto LAB_001bd344;
    auStack_648._40_8_ = (uv__queue *)0x1;
    auStack_648._32_8_ = SEXT48(exit_cb_called);
    if ((uv__queue *)auStack_648._32_8_ != (uv__queue *)0x1) goto LAB_001bd351;
    auStack_648._40_8_ = (uv__queue *)0x2;
    auStack_648._32_8_ = SEXT48(close_cb_called);
    if ((uv__queue *)auStack_648._32_8_ != (uv__queue *)0x2) goto LAB_001bd35e;
    auStack_648._24_8_ = (uv_close_cb)0x1bd2cb;
    puVar4 = (uv_process_options_t *)uv_default_loop();
    auStack_648._24_8_ = (uv_close_cb)0x1bd2df;
    uv_walk((uv_loop_t *)puVar4,close_walk_cb,(void *)0x0);
    auStack_648._24_8_ = (uv_close_cb)0x1bd2e9;
    uv_run((uv_loop_t *)puVar4,UV_RUN_DEFAULT);
    auStack_648._40_8_ = (uv__queue *)0x0;
    auStack_648._24_8_ = (uv_close_cb)0x1bd2f7;
    puVar3 = uv_default_loop();
    auStack_648._24_8_ = (uv_close_cb)0x1bd2ff;
    iVar1 = uv_loop_close(puVar3);
    auStack_648._32_8_ = SEXT48(iVar1);
    if (auStack_648._40_8_ == auStack_648._32_8_) {
      auStack_648._24_8_ = (uv_close_cb)0x1bd315;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStack_648._24_8_ = (uv_close_cb)0x1bd32a;
    run_test_spawn_and_kill_cold_1();
LAB_001bd32a:
    auStack_648._24_8_ = (uv_close_cb)0x1bd337;
    run_test_spawn_and_kill_cold_2();
LAB_001bd337:
    auStack_648._24_8_ = (uv_close_cb)0x1bd344;
    run_test_spawn_and_kill_cold_3();
LAB_001bd344:
    auStack_648._24_8_ = (uv_close_cb)0x1bd351;
    run_test_spawn_and_kill_cold_4();
LAB_001bd351:
    auStack_648._24_8_ = (uv_close_cb)0x1bd35e;
    run_test_spawn_and_kill_cold_5();
LAB_001bd35e:
    auStack_648._24_8_ = (uv_close_cb)0x1bd36b;
    run_test_spawn_and_kill_cold_6();
  }
  puVar7 = (uv_handle_t *)(auStack_648 + 0x28);
  auStack_648._24_8_ = kill_cb;
  run_test_spawn_and_kill_cold_7();
  auStack_648._24_8_ = (uv_close_cb)0x0;
  auStack_648._16_8_ = 0;
  auStack_648._8_8_ = puVar4;
  puts("exit_cb");
  exit_cb_called = exit_cb_called + 1;
  auStack_648._0_8_ = puVar5;
  if (puVar5 == (undefined1 *)0x0) {
    if (extraout_EDX != 0xf) goto LAB_001bd419;
    uv_close(puVar7,close_cb);
    auStack_648._0_8_ = SEXT48(*(int *)&puVar7[1].loop);
    if ((undefined1 *)auStack_648._0_8_ != (undefined1 *)0x0) {
      iVar1 = uv_kill(*(int *)&puVar7[1].loop,0);
      auStack_648._0_8_ = SEXT48(iVar1);
      if ((undefined1 *)auStack_648._0_8_ == (undefined1 *)0xfffffffffffffffd) {
        return iVar1;
      }
      goto LAB_001bd42b;
    }
  }
  else {
    kill_cb_cold_1();
LAB_001bd419:
    kill_cb_cold_2();
  }
  kill_cb_cold_4();
LAB_001bd42b:
  puVar7 = (uv_handle_t *)auStack_648;
  kill_cb_cold_3();
  uv_process_kill(&process,0xf);
  uv_close(puVar7,close_cb);
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(spawn_stdin) {
  int r;
  uv_pipe_t out;
  uv_pipe_t in;
  uv_write_t write_req;
  uv_buf_t buf;
  uv_stdio_container_t stdio[2];
  char buffer[] = "hello-from-spawn_stdin";

  init_process_options("spawn_helper3", exit_cb);

  uv_pipe_init(uv_default_loop(), &out, 0);
  uv_pipe_init(uv_default_loop(), &in, 0);
  options.stdio = stdio;
  options.stdio[0].flags = UV_CREATE_PIPE | UV_READABLE_PIPE;
  options.stdio[0].data.stream = (uv_stream_t*) &in;
  options.stdio[1].flags = UV_CREATE_PIPE | UV_WRITABLE_PIPE;
  options.stdio[1].data.stream = (uv_stream_t*) &out;
  options.stdio_count = 2;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT_OK(r);

  buf.base = buffer;
  buf.len = sizeof(buffer);
  r = uv_write(&write_req, (uv_stream_t*) &in, &buf, 1, write_cb);
  ASSERT_OK(r);

  r = uv_read_start((uv_stream_t*) &out, on_alloc, on_read);
  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(3, close_cb_called); /* Once for process twice for the pipe. */
  ASSERT_OK(strcmp(buffer, output));

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}